

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O0

void __thiscall
fmt::v9::detail::dynamic_arg_list::typed_node<std::__cxx11::string>::
typed_node<std::__cxx11::string>
          (typed_node<std::__cxx11::string> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_local;
  typed_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  node<void>::node((node<void> *)this);
  *(undefined ***)this = &PTR__typed_node_009101e0;
  std::__cxx11::string::string((string *)(this + 0x10),(string *)arg);
  return;
}

Assistant:

FMT_CONSTEXPR typed_node(const Arg& arg) : value(arg) {}